

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtl.cpp
# Opt level: O0

void __thiscall pg::RTLSolver::run(RTLSolver *this)

{
  pointer piVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  ulong *puVar8;
  int *piVar9;
  size_t sVar10;
  uintqueue *puVar11;
  long lVar12;
  uint *puVar13;
  uint *puVar14;
  ostream *poVar15;
  Error *this_00;
  reference ppiVar16;
  vector<int,_std::allocator<int>_> *this_01;
  vector<int,_std::allocator<int>_> *pvVar17;
  ulong uVar18;
  vector<int,_std::allocator<int>_> *local_c8;
  int **x_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<int_*,_std::allocator<int_*>_> *__range1_1;
  int **x;
  iterator __end1;
  iterator __begin1;
  vector<int_*,_std::allocator<int_*>_> *__range1;
  int local_54;
  int i;
  RTLSolver *this_local;
  
  uVar6 = Solver::nodecount(&this->super_Solver);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar6;
  uVar7 = SUB168(auVar2 * ZEXT816(0x18),0);
  uVar18 = uVar7 + 8;
  if (SUB168(auVar2 * ZEXT816(0x18),8) != 0 || 0xfffffffffffffff7 < uVar7) {
    uVar18 = 0xffffffffffffffff;
  }
  puVar8 = (ulong *)operator_new__(uVar18);
  *puVar8 = uVar6;
  pvVar17 = (vector<int,_std::allocator<int>_> *)(puVar8 + 1);
  if (uVar6 != 0) {
    local_c8 = pvVar17;
    do {
      std::vector<int,_std::allocator<int>_>::vector(local_c8);
      local_c8 = local_c8 + 1;
    } while (local_c8 != pvVar17 + uVar6);
  }
  this->tin = pvVar17;
  uVar6 = Solver::nodecount(&this->super_Solver);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar6;
  uVar6 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  piVar9 = (int *)operator_new__(uVar6);
  this->str = piVar9;
  sVar10 = Solver::nodecount(&this->super_Solver);
  bitset::resize(&this->V,sVar10);
  sVar10 = Solver::nodecount(&this->super_Solver);
  bitset::resize(&this->W,sVar10);
  sVar10 = Solver::nodecount(&this->super_Solver);
  bitset::resize(&this->R,sVar10);
  sVar10 = Solver::nodecount(&this->super_Solver);
  bitset::resize(&this->Z,sVar10);
  sVar10 = Solver::nodecount(&this->super_Solver);
  bitset::resize(&this->S,sVar10);
  bitset::operator=(&this->G,(this->super_Solver).disabled);
  bitset::flip(&this->G);
  puVar11 = &this->Q;
  lVar12 = Solver::nodecount(&this->super_Solver);
  (this->Q).pointer = 0;
  if ((puVar11->queue != (uint *)0x0) && (puVar11->queue != (uint *)0x0)) {
    operator_delete__(puVar11->queue);
  }
  auVar2 = ZEXT416((uint)lVar12) * ZEXT816(4);
  uVar6 = auVar2._0_8_;
  if (auVar2._8_8_ != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  puVar13 = (uint *)operator_new__(uVar6);
  puVar11->queue = puVar13;
  puVar11 = &this->tangleto;
  lVar12 = Solver::nodecount(&this->super_Solver);
  (this->tangleto).pointer = 0;
  if ((puVar11->queue != (uint *)0x0) && (puVar11->queue != (uint *)0x0)) {
    operator_delete__(puVar11->queue);
  }
  auVar2 = ZEXT416((uint)lVar12) * ZEXT816(4);
  uVar6 = auVar2._0_8_;
  if (auVar2._8_8_ != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  puVar13 = (uint *)operator_new__(uVar6);
  puVar11->queue = puVar13;
  sVar10 = Solver::nodecount(&this->super_Solver);
  bitset::resize(&this->escapes,sVar10);
  puVar11 = &this->pea_state;
  lVar12 = Solver::nodecount(&this->super_Solver);
  (this->pea_state).pointer = 0;
  if ((puVar11->queue != (uint *)0x0) && (puVar11->queue != (uint *)0x0)) {
    operator_delete__(puVar11->queue);
  }
  auVar2 = ZEXT416((uint)(lVar12 << 1)) * ZEXT816(4);
  uVar6 = auVar2._0_8_;
  if (auVar2._8_8_ != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  puVar13 = (uint *)operator_new__(uVar6);
  puVar11->queue = puVar13;
  puVar11 = &this->pea_S;
  lVar12 = Solver::nodecount(&this->super_Solver);
  (this->pea_S).pointer = 0;
  if ((puVar11->queue != (uint *)0x0) && (puVar11->queue != (uint *)0x0)) {
    operator_delete__(puVar11->queue);
  }
  auVar2 = ZEXT416((uint)lVar12) * ZEXT816(4);
  uVar6 = auVar2._0_8_;
  if (auVar2._8_8_ != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  puVar13 = (uint *)operator_new__(uVar6);
  puVar11->queue = puVar13;
  uVar6 = Solver::nodecount(&this->super_Solver);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar6;
  uVar6 = SUB168(auVar4 * ZEXT816(4),0);
  if (SUB168(auVar4 * ZEXT816(4),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  puVar14 = (uint *)operator_new__(uVar6);
  this->pea_vidx = puVar14;
  sVar10 = Solver::nodecount(&this->super_Solver);
  bitset::resize(&this->pea_root,sVar10);
  if ((this->onesided & 1U) == 0) {
    do {
      bVar5 = bitset::any(&this->G);
      if (!bVar5) break;
      if ((this->super_Solver).trace != 0) {
        poVar15 = std::operator<<((this->super_Solver).logger,
                                  "\x1b[1;38;5;196miteration\x1b[m \x1b[1;36m");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,this->iterations);
        poVar15 = std::operator<<(poVar15,"\x1b[m");
        std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
      }
      this->iterations = this->iterations + 1;
      bVar5 = rtl(this,&this->G,-1,0);
    } while (bVar5);
  }
  else {
    do {
      bVar5 = bitset::any(&this->G);
      if (!bVar5) break;
      if ((this->super_Solver).trace != 0) {
        poVar15 = std::operator<<((this->super_Solver).logger,
                                  "\x1b[1;38;5;196miteration\x1b[m even-\x1b[1;36m");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,this->iterations);
        poVar15 = std::operator<<(poVar15,"\x1b[m");
        std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
      }
      this->iterations = this->iterations + 1;
      bVar5 = rtl(this,&this->G,0,0);
    } while (bVar5);
    do {
      bVar5 = bitset::any(&this->G);
      if (!bVar5) break;
      if ((this->super_Solver).trace != 0) {
        poVar15 = std::operator<<((this->super_Solver).logger,
                                  "\x1b[1;38;5;196miteration\x1b[m odd-\x1b[1;36m");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,this->iterations);
        poVar15 = std::operator<<(poVar15,"\x1b[m");
        std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
      }
      this->iterations = this->iterations + 1;
      bVar5 = rtl(this,&this->G,1,0);
    } while (bVar5);
  }
  poVar15 = std::operator<<((this->super_Solver).logger,"found ");
  poVar15 = (ostream *)std::ostream::operator<<(poVar15,this->dominions);
  poVar15 = std::operator<<(poVar15," dominions and ");
  poVar15 = (ostream *)std::ostream::operator<<(poVar15,this->tangles);
  poVar15 = std::operator<<(poVar15," tangles.");
  std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
  poVar15 = std::operator<<((this->super_Solver).logger,"solved in ");
  poVar15 = (ostream *)std::ostream::operator<<(poVar15,this->iterations);
  poVar15 = std::operator<<(poVar15," iterations.");
  std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
  local_54 = 0;
  while( true ) {
    lVar12 = Solver::nodecount(&this->super_Solver);
    if (lVar12 <= local_54) {
      __end1 = std::vector<int_*,_std::allocator<int_*>_>::begin(&this->tv);
      x = (int **)std::vector<int_*,_std::allocator<int_*>_>::end(&this->tv);
      while (bVar5 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>
                                         *)&x), bVar5) {
        ppiVar16 = __gnu_cxx::__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>
                   ::operator*(&__end1);
        if (*ppiVar16 != (int *)0x0) {
          operator_delete__(*ppiVar16);
        }
        __gnu_cxx::__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>::
        operator++(&__end1);
      }
      __end1_1 = std::vector<int_*,_std::allocator<int_*>_>::begin(&this->tout);
      x_1 = (int **)std::vector<int_*,_std::allocator<int_*>_>::end(&this->tout);
      while (bVar5 = __gnu_cxx::operator!=
                               (&__end1_1,
                                (__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>
                                 *)&x_1), bVar5) {
        ppiVar16 = __gnu_cxx::__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>
                   ::operator*(&__end1_1);
        if (*ppiVar16 != (int *)0x0) {
          operator_delete__(*ppiVar16);
        }
        __gnu_cxx::__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>::
        operator++(&__end1_1);
      }
      pvVar17 = this->tin;
      if (pvVar17 != (vector<int,_std::allocator<int>_> *)0x0) {
        piVar1 = pvVar17[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        this_01 = pvVar17 + (long)piVar1;
        while (pvVar17 != this_01) {
          this_01 = this_01 + -1;
          std::vector<int,_std::allocator<int>_>::~vector(this_01);
        }
        operator_delete__(&pvVar17[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(long)piVar1 * 0x18 + 8);
      }
      if (this->str != (int *)0x0) {
        operator_delete__(this->str);
      }
      if (this->pea_vidx != (uint *)0x0) {
        operator_delete__(this->pea_vidx);
      }
      return;
    }
    bVar5 = bitset::operator[]((this->super_Solver).disabled,(long)local_54);
    if (!bVar5) break;
    local_54 = local_54 + 1;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x40);
  Error::Error(this_00,"search was incomplete!",
               "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/rtl.cpp"
               ,0x287);
  __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
}

Assistant:

void
RTLSolver::run()
{
    tin = new std::vector<int>[nodecount()];
    str = new int[nodecount()];

    V.resize(nodecount());
    W.resize(nodecount());
    R.resize(nodecount());
    Z.resize(nodecount());
    S.resize(nodecount());
    G = disabled;
    G.flip();

    Q.resize(nodecount());

    tangleto.resize(nodecount());
    escapes.resize(nodecount());

    pea_state.resize(nodecount()*2);
    pea_S.resize(nodecount());
    pea_vidx = new unsigned int[nodecount()];
    pea_root.resize(nodecount());

    if (onesided) {
        while (G.any()) {
#ifndef NDEBUG
            if (trace) logger << "\033[1;38;5;196miteration\033[m even-\033[1;36m" << iterations << "\033[m" << std::endl;
#endif
            iterations++;

            if (!rtl(G, 0, 0)) break;
        }
        while (G.any()) {
#ifndef NDEBUG
            if (trace) logger << "\033[1;38;5;196miteration\033[m odd-\033[1;36m" << iterations << "\033[m" << std::endl;
#endif
            iterations++;

            if (!rtl(G, 1, 0)) break;
        }
    } else {
        while (G.any()) {
#ifndef NDEBUG
            if (trace) logger << "\033[1;38;5;196miteration\033[m \033[1;36m" << iterations << "\033[m" << std::endl;
#endif
            iterations++;

            if (!rtl(G, -1, 0)) break;
        }
    }

    logger << "found " << dominions << " dominions and "<< tangles << " tangles." << std::endl;
    logger << "solved in " << iterations << " iterations." << std::endl;

#ifndef NDEBUG
    // Check if the whole game is now solved
    for (int i=0; i<nodecount(); i++) {
        if (!disabled[i]) { THROW_ERROR("search was incomplete!"); }
    }
#endif

    // Free all explicitly allocated memory
    for (auto &x : tv) delete[] x;
    for (auto &x : tout) delete[] x;
    delete[] tin;
    delete[] str;
    delete[] pea_vidx;
}